

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.h
# Opt level: O0

void __thiscall
cmGetCMakePropertyCommand::~cmGetCMakePropertyCommand(cmGetCMakePropertyCommand *this)

{
  cmGetCMakePropertyCommand *this_local;
  
  ~cmGetCMakePropertyCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmGetCMakePropertyCommand; }